

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid.c
# Opt level: O0

void * lyplg_type_print_instanceid
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  char *value_00;
  LY_ERR LVar1;
  size_t sVar2;
  ly_err_item *local_60;
  ly_err_item *err;
  ly_path *target;
  ly_path *p;
  char *ret;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *prefix_data_local;
  lyd_value *plStack_20;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *ctx_local;
  
  p = (ly_path *)0x0;
  target = (ly_path *)0x0;
  ret = (char *)value_len;
  value_len_local = (size_t *)dynamic;
  dynamic_local = (ly_bool *)prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_20 = value;
  value_local = (lyd_value *)ctx;
  if (((format == LY_VALUE_CANON) || (format == LY_VALUE_JSON)) || (format == LY_VALUE_LYB)) {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar2 = strlen(value->_canonical);
      *(size_t *)ret = sVar2;
    }
    return plStack_20->_canonical;
  }
  if ((value->field_2).dec64 == 0) {
    value_00 = value->_canonical;
    sVar2 = strlen(value->_canonical);
    LVar1 = lyplg_type_lypath_new
                      (ctx,value_00,sVar2,0,LY_VALUE_JSON,(void *)0x0,(lysc_node *)0x0,
                       (lys_glob_unres *)0x0,&target,&local_60);
    if (LVar1 != LY_SUCCESS) {
      if (local_60 != (ly_err_item *)0x0) {
        ly_err_print((ly_ctx *)value_local,local_60);
        ly_err_free(local_60);
      }
      goto LAB_002349d5;
    }
    err = (ly_err_item *)target;
  }
  else {
    err = (ly_err_item *)(value->field_2).enum_item;
  }
  LVar1 = instanceid_path2str((ly_path *)err,prefix_data_local._4_4_,dynamic_local,(char **)&p);
  if ((LVar1 == LY_SUCCESS) && (*(undefined1 *)value_len_local = 1, ret != (char *)0x0)) {
    sVar2 = strlen((char *)p);
    *(size_t *)ret = sVar2;
  }
LAB_002349d5:
  ly_path_free(target);
  return p;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_instanceid(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *prefix_data, ly_bool *dynamic, size_t *value_len)
{
    char *ret = NULL;
    struct ly_path *p = NULL;
    const struct ly_path *target;
    struct ly_err_item *err;

    if ((format == LY_VALUE_CANON) || (format == LY_VALUE_JSON) || (format == LY_VALUE_LYB)) {
        if (dynamic) {
            *dynamic = 0;
        }
        if (value_len) {
            *value_len = strlen(value->_canonical);
        }
        return value->_canonical;
    }

    if (!value->target) {
        /* schema default value, compile it first */
        if (lyplg_type_lypath_new(ctx, value->_canonical, strlen(value->_canonical), 0, LY_VALUE_JSON, NULL, NULL,
                NULL, &p, &err)) {
            if (err) {
                ly_err_print(ctx, err);
                ly_err_free(err);
            }
            goto cleanup;
        }

        target = p;
    } else {
        target = value->target;
    }

    /* print the value in the specific format */
    if (instanceid_path2str(target, format, prefix_data, &ret)) {
        goto cleanup;
    }

    *dynamic = 1;
    if (value_len) {
        *value_len = strlen(ret);
    }

cleanup:
    ly_path_free(p);
    return ret;
}